

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteTranslational::Initialize
          (ChLinkRevoluteTranslational *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,bool local,ChVector<double> *p1,ChVector<double> *dirZ1,
          ChVector<double> *p2,ChVector<double> *dirX2,ChVector<double> *dirY2,bool auto_distance,
          double distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  element_type *peVar17;
  ulong uVar18;
  byte bVar19;
  double dVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  bool bVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar27;
  ChBodyFrame *pCVar28;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  double dVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  double local_48;
  double local_40;
  double local_38;
  double dVar29;
  
  peVar17 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar28 = &peVar17->super_ChBodyFrame;
  if (peVar17 == (element_type *)0x0) {
    pCVar28 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar28;
  peVar17 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar27 = &peVar17->super_ChBodyFrame;
  if (peVar17 == (element_type *)0x0) {
    pCVar27 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar27;
  iVar25 = (*(pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar26 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar25),
             (ChVariables *)CONCAT44(extraout_var_00,iVar26));
  iVar25 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar26 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar25),
             (ChVariables *)CONCAT44(extraout_var_02,iVar26));
  iVar25 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar26 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar25),
             (ChVariables *)CONCAT44(extraout_var_04,iVar26));
  iVar25 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar26 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar25),
             (ChVariables *)CONCAT44(extraout_var_06,iVar26));
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    dVar88 = dirZ1->m_data[1];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dirZ1->m_data[0];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dirZ1->m_data[2];
    local_40 = p1->m_data[1];
    local_48 = p1->m_data[0];
    local_38 = p1->m_data[2];
    dVar1 = p2->m_data[0];
    dVar56 = p2->m_data[1];
    dVar2 = p2->m_data[2];
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dirY2->m_data[1];
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dirY2->m_data[0];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dirY2->m_data[2];
    pCVar28 = (this->super_ChLink).Body1;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar88 * dVar88;
    auVar37 = vfmadd231sd_fma(auVar65,auVar55,auVar55);
    auVar37 = vfmadd231sd_fma(auVar37,auVar62,auVar62);
    auVar37 = vsqrtsd_avx(auVar37,auVar37);
    bVar23 = 2.2250738585072014e-308 <= auVar37._0_8_;
    dVar66 = 1.0 / auVar37._0_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dirX2->m_data[2];
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dirX2->m_data[0];
    auVar40._0_8_ =
         (ulong)bVar23 * (long)(dirZ1->m_data[0] * dVar66) + (ulong)!bVar23 * 0x3ff0000000000000;
    auVar40._8_8_ = 0;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dirX2->m_data[1];
    dVar20 = (double)((ulong)bVar23 * (long)(dVar88 * dVar66));
    uVar21 = (ulong)bVar23 * (long)(dirZ1->m_data[2] * dVar66);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar21;
    auVar37 = vunpcklpd_avx(auVar75,auVar69);
    auVar35 = vunpcklpd_avx(auVar78,auVar71);
    auVar90._0_8_ = auVar35._0_8_ * auVar35._0_8_;
    auVar90._8_8_ = auVar35._8_8_ * auVar35._8_8_;
    auVar35 = vfmadd213pd_fma(auVar37,auVar37,auVar90);
    auVar37 = vunpcklpd_avx(auVar80,auVar73);
    auVar37 = vfmadd213pd_fma(auVar37,auVar37,auVar35);
    auVar35 = vsqrtpd_avx(auVar37);
    auVar22._8_8_ = 0x10000000000000;
    auVar22._0_8_ = 0x10000000000000;
    uVar18 = vcmppd_avx512vl(auVar35,auVar22,5);
    auVar37 = vshufpd_avx(auVar35,auVar35,1);
    dVar88 = 1.0 / auVar35._0_8_;
    dVar66 = 1.0 / auVar37._0_8_;
    uVar24 = (uVar18 & 3) >> 1;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0]
    ;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_48;
    auVar33 = vsubsd_avx512f(auVar110,auVar37);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1]
    ;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_40;
    auVar37 = vsubsd_avx512f(auVar114,auVar35);
    bVar19 = (byte)(uVar18 & 3);
    auVar38._0_8_ =
         (ulong)(bVar19 & 1) * (long)(dirY2->m_data[0] * dVar88) +
         (ulong)!(bool)(bVar19 & 1) * 0x3ff0000000000000;
    auVar38._8_8_ = 0;
    dVar30 = (double)((ulong)(bVar19 & 1) * (long)(dirY2->m_data[1] * dVar88));
    uVar18 = (ulong)(bVar19 & 1) * (long)(dirY2->m_data[2] * dVar88);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar18;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2]
    ;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_38;
    auVar31 = vsubsd_avx512f(auVar116,auVar31);
    auVar42._0_8_ =
         uVar24 * (long)(dVar66 * dirX2->m_data[0]) + (ulong)!SUB81(uVar24,0) * 0x3ff0000000000000;
    auVar42._8_8_ = 0;
    dVar88 = auVar37._0_8_;
    dVar29 = (double)(uVar24 * (long)(dirX2->m_data[1] * dVar66));
    uVar24 = uVar24 * (long)(dirX2->m_data[2] * dVar66);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar24;
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar107._8_8_ = 0;
    auVar107._0_8_ =
         dVar88 * (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar37 = vfmadd231sd_fma(auVar107,auVar33,auVar32);
    auVar91._0_8_ = auVar33._0_8_;
    auVar91._8_8_ = auVar91._0_8_;
    auVar101._0_8_ =
         dVar88 * (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar101._8_8_ =
         dVar88 * (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar35 = vfmadd231sd_fma(auVar37,auVar31,auVar33);
    auVar81._0_8_ = auVar31._0_8_;
    auVar81._8_8_ = auVar81._0_8_;
    auVar37 = vfmadd132pd_fma(auVar91,auVar101,
                              *(undefined1 (*) [16])
                               (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar37 = vfmadd132pd_fma(auVar81,auVar37,
                              *(undefined1 (*) [16])
                               ((pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])(this->m_p1).m_data = auVar37;
    (this->m_p1).m_data[2] = auVar35._0_8_;
    pCVar27 = (this->super_ChLink).Body2;
    dVar88 = dVar56 - (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                      [1];
    dVar66 = dVar1 - (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                     [0];
    dVar3 = dVar2 - (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2]
    ;
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar92._8_8_ = 0;
    auVar92._0_8_ = dVar66;
    auVar108._8_8_ = 0;
    auVar108._0_8_ =
         dVar88 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar37 = vfmadd231sd_fma(auVar108,auVar92,auVar34);
    auVar102._0_8_ =
         dVar88 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar102._8_8_ =
         dVar88 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar93._8_8_ = dVar66;
    auVar93._0_8_ = dVar66;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar3;
    auVar35 = vfmadd231sd_fma(auVar37,auVar82,auVar10);
    auVar83._8_8_ = dVar3;
    auVar83._0_8_ = dVar3;
    auVar37 = vfmadd132pd_fma(auVar93,auVar102,
                              *(undefined1 (*) [16])
                               (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar103._8_8_ = auVar40._0_8_;
    auVar103._0_8_ = auVar40._0_8_;
    auVar37 = vfmadd132pd_fma(auVar83,auVar37,
                              *(undefined1 (*) [16])
                               ((pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])(this->m_p2).m_data = auVar37;
    (this->m_p2).m_data[2] = auVar35._0_8_;
    auVar94._0_8_ =
         dVar20 * (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar94._8_8_ =
         dVar20 * (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar84._8_8_ = 0;
    auVar84._0_8_ =
         dVar20 * (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar35 = vfmadd231sd_fma(auVar84,auVar40,auVar11);
    auVar37 = vfmadd132pd_fma(auVar103,auVar94,
                              *(undefined1 (*) [16])
                               (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar95._8_8_ = uVar21;
    auVar95._0_8_ = uVar21;
    auVar37 = vfmadd132pd_fma(auVar95,auVar37,
                              *(undefined1 (*) [16])
                               ((pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar35 = vfmadd231sd_fma(auVar35,auVar41,auVar12);
    auVar104._8_8_ = auVar42._0_8_;
    auVar104._0_8_ = auVar42._0_8_;
    *(undefined1 (*) [16])(this->m_z1).m_data = auVar37;
    (this->m_z1).m_data[2] = auVar35._0_8_;
    auVar96._0_8_ =
         dVar29 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar96._8_8_ =
         dVar29 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         dVar29 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar35 = vfmadd231sd_fma(auVar85,auVar42,auVar13);
    auVar37 = vfmadd132pd_fma(auVar104,auVar96,
                              *(undefined1 (*) [16])
                               (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar97._8_8_ = uVar24;
    auVar97._0_8_ = uVar24;
    auVar37 = vfmadd132pd_fma(auVar97,auVar37,
                              *(undefined1 (*) [16])
                               ((pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar35 = vfmadd231sd_fma(auVar35,auVar36,auVar14);
    auVar105._8_8_ = auVar38._0_8_;
    auVar105._0_8_ = auVar38._0_8_;
    *(undefined1 (*) [16])(this->m_x2).m_data = auVar37;
    (this->m_x2).m_data[2] = auVar35._0_8_;
    auVar98._0_8_ =
         dVar30 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar98._8_8_ =
         dVar30 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         dVar30 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar35 = vfmadd231sd_fma(auVar86,auVar38,auVar15);
    auVar37 = vfmadd132pd_fma(auVar105,auVar98,
                              *(undefined1 (*) [16])
                               (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar99._8_8_ = uVar18;
    auVar99._0_8_ = uVar18;
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar35 = vfmadd231sd_fma(auVar35,auVar39,auVar16);
    auVar37 = vfmadd132pd_fma(auVar99,auVar37,
                              *(undefined1 (*) [16])
                               ((pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])(this->m_y2).m_data = auVar37;
    (this->m_y2).m_data[2] = auVar35._0_8_;
  }
  else {
    if (&this->m_p1 != p1) {
      (this->m_p1).m_data[0] = p1->m_data[0];
      (this->m_p1).m_data[1] = p1->m_data[1];
      (this->m_p1).m_data[2] = p1->m_data[2];
    }
    if (&this->m_p2 != p2) {
      (this->m_p2).m_data[0] = p2->m_data[0];
      (this->m_p2).m_data[1] = p2->m_data[1];
      (this->m_p2).m_data[2] = p2->m_data[2];
    }
    dVar88 = dirZ1->m_data[1];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dirZ1->m_data[0];
    dVar1 = dirZ1->m_data[2];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar1;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar88 * dVar88;
    auVar37 = vfmadd231sd_fma(auVar43,auVar50,auVar50);
    auVar37 = vfmadd231sd_fma(auVar37,auVar45,auVar45);
    auVar37 = vsqrtsd_avx(auVar37,auVar37);
    dVar56 = 1.0 / auVar37._0_8_;
    bVar23 = 2.2250738585072014e-308 <= auVar37._0_8_;
    (this->m_z1).m_data[0] =
         (double)((ulong)bVar23 * (long)(dirZ1->m_data[0] * dVar56) +
                 (ulong)!bVar23 * 0x3ff0000000000000);
    (this->m_z1).m_data[1] = (double)((ulong)bVar23 * (long)(dVar88 * dVar56));
    (this->m_z1).m_data[2] = (double)((ulong)bVar23 * (long)(dVar1 * dVar56));
    dVar88 = dirX2->m_data[1];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dirX2->m_data[0];
    dVar1 = dirX2->m_data[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar1;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar88 * dVar88;
    auVar37 = vfmadd231sd_fma(auVar57,auVar51,auVar51);
    auVar37 = vfmadd231sd_fma(auVar37,auVar46,auVar46);
    auVar37 = vsqrtsd_avx(auVar37,auVar37);
    dVar56 = 1.0 / auVar37._0_8_;
    bVar23 = 2.2250738585072014e-308 <= auVar37._0_8_;
    (this->m_x2).m_data[0] =
         (double)((ulong)bVar23 * (long)(dirX2->m_data[0] * dVar56) +
                 (ulong)!bVar23 * 0x3ff0000000000000);
    (this->m_x2).m_data[1] = (double)((ulong)bVar23 * (long)(dVar88 * dVar56));
    (this->m_x2).m_data[2] = (double)((ulong)bVar23 * (long)(dVar1 * dVar56));
    dVar88 = dirY2->m_data[1];
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dirY2->m_data[0];
    dVar1 = dirY2->m_data[2];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar1;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar88 * dVar88;
    auVar37 = vfmadd231sd_fma(auVar58,auVar52,auVar52);
    auVar37 = vfmadd231sd_fma(auVar37,auVar47,auVar47);
    auVar37 = vsqrtsd_avx(auVar37,auVar37);
    dVar56 = 1.0 / auVar37._0_8_;
    bVar23 = 2.2250738585072014e-308 <= auVar37._0_8_;
    (this->m_y2).m_data[0] =
         (double)((ulong)bVar23 * (long)(dirY2->m_data[0] * dVar56) +
                 (ulong)!bVar23 * 0x3ff0000000000000);
    (this->m_y2).m_data[1] = (double)((ulong)bVar23 * (long)(dVar88 * dVar56));
    (this->m_y2).m_data[2] = (double)((ulong)bVar23 * (long)(dVar1 * dVar56));
    pCVar28 = (this->super_ChLink).Body1;
    ChTransform<double>::TransformLocalToParent
              (&this->m_p1,&(pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    pCVar28 = (this->super_ChLink).Body2;
    ChTransform<double>::TransformLocalToParent
              (&this->m_p2,&(pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    pCVar28 = (this->super_ChLink).Body2;
    pCVar27 = (this->super_ChLink).Body1;
    dVar88 = (this->m_z1).m_data[1];
    dVar1 = (this->m_x2).m_data[1];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar1;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = (this->m_z1).m_data[0];
    dVar56 = (this->m_y2).m_data[1];
    dVar2 = (this->m_y2).m_data[0];
    auVar67._8_8_ = 0;
    auVar67._0_8_ = (this->m_z1).m_data[2];
    auVar89._8_8_ = 0;
    auVar89._0_8_ = (this->m_x2).m_data[2];
    dVar66 = (this->m_y2).m_data[2];
    dVar3 = (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
            super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar106._8_8_ = 0;
    auVar106._0_8_ = dVar3;
    dVar30 = (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar30;
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar100._8_8_ = 0;
    auVar100._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar79._8_8_ = 0;
    auVar79._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         dVar88 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar37 = vfmadd231sd_fma(auVar54,auVar63,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         dVar88 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar35 = vfmadd231sd_fma(auVar59,auVar63,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         dVar88 * (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar31 = vfmadd231sd_fma(auVar61,auVar63,auVar6);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = (this->m_x2).m_data[0];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar40 = vfmadd231sd_fma(auVar37,auVar67,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar37 = vfmadd231sd_fma(auVar35,auVar67,auVar8);
    dVar20 = auVar37._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar27->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar41 = vfmadd231sd_fma(auVar31,auVar67,auVar9);
    auVar115._8_8_ = 0;
    auVar115._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar31 = vmulsd_avx512f(auVar72,auVar115);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar30 * dVar1;
    auVar37 = vfmadd231sd_fma(auVar68,auVar74,auVar64);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar1 * dVar3;
    auVar35 = vfmadd231sd_fma(auVar70,auVar100,auVar64);
    auVar112._8_8_ = 0;
    auVar112._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar31 = vfmadd231sd_avx512f(auVar31,auVar112,auVar64);
    auVar119._8_8_ = 0;
    auVar119._0_8_ = dVar56;
    auVar32 = vmulsd_avx512f(auVar77,auVar119);
    auVar33 = vmulsd_avx512f(auVar115,auVar119);
    auVar123._8_8_ = 0;
    auVar123._0_8_ = dVar2;
    auVar32 = vfmadd231sd_avx512f(auVar32,auVar123,auVar74);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = dVar56;
    auVar34 = vmulsd_avx512f(auVar106,auVar120);
    auVar33 = vfmadd231sd_avx512f(auVar33,auVar112,auVar123);
    auVar109._8_8_ = 0;
    auVar109._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar35 = vfmadd231sd_avx512f(auVar35,auVar109,auVar89);
    dVar29 = auVar35._0_8_;
    auVar42 = vfmadd231sd_fma(auVar37,auVar79,auVar89);
    auVar118._8_8_ = 0;
    auVar118._0_8_ =
         (pCVar28->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar36 = vfmadd231sd_avx512f(auVar31,auVar118,auVar89);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = dVar2;
    auVar37 = vfmadd231sd_avx512f(auVar34,auVar124,auVar100);
    auVar121._8_8_ = 0;
    auVar121._0_8_ = dVar66;
    auVar38 = vfmadd231sd_avx512f(auVar32,auVar121,auVar79);
    auVar39 = vfmadd231sd_avx512f(auVar33,auVar118,auVar121);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = dVar66;
    auVar37 = vfmadd231sd_avx512f(auVar37,auVar122,auVar109);
    dVar30 = auVar37._0_8_;
    dVar1 = local_48;
    dVar2 = local_38;
    dVar56 = local_40;
  }
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar56;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = local_40;
  auVar32 = vsubsd_avx512f(auVar48,auVar113);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = local_48;
  auVar33 = vsubsd_avx512f(auVar44,auVar111);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_38;
  auVar34 = vsubsd_avx512f(auVar53,auVar117);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar29 * dVar20;
  auVar37 = vfmadd231sd_fma(auVar87,auVar40,auVar42);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar30 * dVar20;
  auVar35 = vfmadd231sd_fma(auVar76,auVar40,auVar38);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar20 * auVar32._0_8_;
  auVar31 = vfmadd231sd_fma(auVar60,auVar33,auVar40);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar29 * auVar32._0_8_;
  auVar32 = vfmadd231sd_fma(auVar49,auVar33,auVar42);
  auVar37 = vfmadd231sd_fma(auVar37,auVar41,auVar36);
  auVar35 = vfmadd231sd_fma(auVar35,auVar41,auVar39);
  auVar32 = vfmadd231sd_fma(auVar32,auVar34,auVar36);
  auVar31 = vfmadd231sd_fma(auVar31,auVar34,auVar41);
  this->m_cur_par1 = auVar37._0_8_;
  this->m_cur_par2 = auVar35._0_8_;
  this->m_cur_dot = auVar31._0_8_;
  this->m_cur_dist = auVar32._0_8_;
  this->m_dist = (double)((ulong)auto_distance * (long)auVar32._0_8_ +
                         (ulong)!auto_distance * (long)distance);
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Initialize(std::shared_ptr<ChBody> body1,
                                             std::shared_ptr<ChBody> body2,
                                             bool local,
                                             const ChVector<>& p1,
                                             const ChVector<>& dirZ1,
                                             const ChVector<>& p2,
                                             const ChVector<>& dirX2,
                                             const ChVector<>& dirY2,
                                             bool auto_distance,
                                             double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_par1.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_par2.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> p1_abs;
    ChVector<> p2_abs;
    ChVector<> z1_abs;
    ChVector<> x2_abs;
    ChVector<> y2_abs;

    if (local) {
        m_p1 = p1;
        m_p2 = p2;
        m_z1 = Vnorm(dirZ1);
        m_x2 = Vnorm(dirX2);
        m_y2 = Vnorm(dirY2);
        p1_abs = Body1->TransformPointLocalToParent(m_p1);
        p2_abs = Body2->TransformPointLocalToParent(m_p2);
        z1_abs = Body1->TransformDirectionLocalToParent(m_z1);
        x2_abs = Body2->TransformDirectionLocalToParent(m_x2);
        y2_abs = Body2->TransformDirectionLocalToParent(m_y2);
    } else {
        p1_abs = p1;
        p2_abs = p2;
        z1_abs = Vnorm(dirZ1);
        x2_abs = Vnorm(dirX2);
        y2_abs = Vnorm(dirY2);
        m_p1 = Body1->TransformPointParentToLocal(p1_abs);
        m_p2 = Body2->TransformPointParentToLocal(p2_abs);
        m_z1 = Body1->TransformDirectionParentToLocal(z1_abs);
        m_x2 = Body2->TransformDirectionParentToLocal(x2_abs);
        m_y2 = Body2->TransformDirectionParentToLocal(y2_abs);
    }

    ChVector<> d12_abs = p2_abs - p1_abs;

    m_cur_par1 = Vdot(z1_abs, x2_abs);
    m_cur_par2 = Vdot(z1_abs, y2_abs);
    m_cur_dot = Vdot(d12_abs, z1_abs);
    m_cur_dist = Vdot(d12_abs, x2_abs);

    m_dist = auto_distance ? m_cur_dist : distance;
}